

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int ptls_esni_init_context
              (ptls_context_t *ctx,ptls_esni_context_t *esni,ptls_iovec_t esni_keys,
              ptls_key_exchange_context_t **key_exchanges)

{
  ushort *end;
  long *plVar1;
  ushort uVar2;
  int iVar3;
  ptls_key_exchange_context_t **pppVar4;
  ulong uVar5;
  ulong uVar6;
  ushort *puVar7;
  anon_struct_72_2_510fbff9 *paVar8;
  ptls_cipher_suite_t *ppVar9;
  ptls_hash_context_t *ppVar10;
  ulong uVar11;
  ushort *puVar12;
  ushort *puVar13;
  long lVar14;
  ptls_key_exchange_context_t *ppVar15;
  long lVar16;
  size_t __size;
  ushort *puVar17;
  long local_48;
  long local_40;
  ushort *local_38;
  
  uVar11 = esni_keys.len;
  puVar13 = (ushort *)esni_keys.base;
  __size = 0;
  do {
    plVar1 = (long *)((long)key_exchanges + __size);
    __size = __size + 8;
  } while (*plVar1 != 0);
  esni->not_before = 0;
  esni->not_after = 0;
  esni->cipher_suites = (anon_struct_72_2_510fbff9 *)0x0;
  *(undefined8 *)&esni->padded_length = 0;
  *(undefined8 *)&esni->version = 0;
  pppVar4 = (ptls_key_exchange_context_t **)malloc(__size);
  esni->key_exchanges = pppVar4;
  if (pppVar4 == (ptls_key_exchange_context_t **)0x0) goto LAB_0011431a;
  memcpy(pppVar4,key_exchanges,__size);
  if (1 < (long)uVar11) {
    esni->version = *puVar13 << 8 | *puVar13 >> 8;
    iVar3 = 0x33;
    if (uVar11 < 6) goto LAB_00114320;
    if (((uVar11 & 0x7ffffffffffffffe) != 6) &&
       (uVar5 = (ulong)(ushort)(puVar13[3] << 8 | puVar13[3] >> 8), uVar5 <= uVar11 - 8)) {
      end = (ushort *)((long)puVar13 + uVar11);
      puVar17 = (ushort *)((long)puVar13 + uVar5 + 8);
      if (1 < (ulong)((long)end - (long)puVar17)) {
        uVar2 = *puVar17;
        uVar6 = (ulong)(ushort)(uVar2 << 8 | uVar2 >> 8);
        puVar17 = (ushort *)((long)puVar13 + uVar5 + 10);
        if (uVar6 <= (ulong)((long)end - (long)puVar17)) {
          puVar7 = (ushort *)(uVar6 + (long)puVar17);
          do {
            if (((long)puVar7 - (long)puVar17 < 2) || (((long)puVar7 - (long)puVar17) - 2U < 2))
            goto LAB_00113fad;
            uVar5 = (ulong)(ushort)(puVar17[1] << 8 | puVar17[1] >> 8);
            if ((ulong)((long)puVar7 - (long)(puVar17 + 2)) < uVar5) goto LAB_00113fad;
            ppVar15 = *key_exchanges;
            if (ppVar15 != (ptls_key_exchange_context_t *)0x0) {
              pppVar4 = key_exchanges + 1;
              do {
                if (ppVar15->algo->id == (uint16_t)(*puVar17 << 8 | *puVar17 >> 8)) break;
                ppVar15 = *pppVar4;
                pppVar4 = pppVar4 + 1;
              } while (ppVar15 != (ptls_key_exchange_context_t *)0x0);
            }
            puVar17 = (ushort *)((long)(puVar17 + 2) + uVar5);
          } while (puVar17 != puVar7);
          if (1 < (ulong)((long)end - (long)puVar7)) {
            uVar5 = (ulong)(ushort)(*puVar17 << 8 | *puVar17 >> 8);
            puVar17 = puVar17 + 1;
            local_38 = puVar17;
            if (uVar5 <= (ulong)((long)end - (long)puVar17)) {
              puVar7 = (ushort *)(uVar5 + (long)puVar17);
              paVar8 = (anon_struct_72_2_510fbff9 *)0x0;
              lVar16 = 0;
              do {
                if ((long)puVar7 - (long)puVar17 < 2) goto LAB_00113fad;
                ppVar9 = *ctx->cipher_suites;
                if (ppVar9 != (ptls_cipher_suite_t *)0x0) {
                  lVar14 = 0;
                  do {
                    if (ppVar9->id == (uint16_t)(*puVar17 << 8 | *puVar17 >> 8)) {
                      paVar8 = (anon_struct_72_2_510fbff9 *)realloc(paVar8,(lVar16 * 8 + 8) * 9);
                      if (paVar8 == (anon_struct_72_2_510fbff9 *)0x0) goto LAB_0011431a;
                      esni->cipher_suites = paVar8;
                      paVar8[lVar16].cipher_suite =
                           *(ptls_cipher_suite_t **)((long)ctx->cipher_suites + lVar14);
                      lVar16 = lVar16 + 1;
                      break;
                    }
                    ppVar9 = *(ptls_cipher_suite_t **)((long)ctx->cipher_suites + lVar14 + 8);
                    lVar14 = lVar14 + 8;
                  } while (ppVar9 != (ptls_cipher_suite_t *)0x0);
                }
                puVar17 = puVar17 + 1;
              } while (puVar17 != puVar7);
              paVar8 = (anon_struct_72_2_510fbff9 *)realloc(paVar8,lVar16 * 0x48 + 0x48);
              if (paVar8 == (anon_struct_72_2_510fbff9 *)0x0) {
LAB_0011431a:
                iVar3 = 0x201;
                goto LAB_00114320;
              }
              esni->cipher_suites = paVar8;
              paVar8[lVar16].cipher_suite = (ptls_cipher_suite_t *)0x0;
              if (1 < (long)end - (long)puVar7) {
                esni->padded_length = *puVar7 << 8 | *puVar7 >> 8;
                local_38 = puVar7 + 1;
                iVar3 = ptls_decode64(&esni->not_before,(uint8_t **)&local_38,(uint8_t *)end);
                if ((iVar3 != 0) ||
                   (iVar3 = ptls_decode64(&esni->not_after,(uint8_t **)&local_38,(uint8_t *)end),
                   iVar3 != 0)) goto LAB_00114320;
                if (1 < (ulong)((long)end - (long)local_38)) {
                  uVar5 = (ulong)(ushort)(*local_38 << 8 | *local_38 >> 8);
                  puVar17 = local_38 + 1;
                  if (uVar5 <= (ulong)((long)end - (long)puVar17)) {
                    puVar12 = (ushort *)(uVar5 + (long)puVar17);
                    puVar7 = puVar17;
                    for (; puVar17 != puVar12; puVar17 = (ushort *)((long)(puVar17 + 2) + uVar5)) {
                      if (((long)puVar12 - (long)puVar17 < 2) ||
                         (((long)puVar12 - (long)puVar17) - 2U < 2)) goto LAB_00113fad;
                      uVar5 = (ulong)(ushort)(puVar17[1] << 8 | puVar17[1] >> 8);
                      if ((ulong)((long)puVar12 - (long)(puVar17 + 2)) < uVar5) goto LAB_00113fad;
                      puVar7 = puVar12;
                    }
                    iVar3 = 0x32;
                    if (puVar7 != end) goto LAB_00114320;
                    paVar8 = esni->cipher_suites;
                    ppVar9 = paVar8->cipher_suite;
                    if (ppVar9 == (ptls_cipher_suite_t *)0x0) {
                      return 0;
                    }
                    local_40 = 0x48;
                    local_48 = 0;
                    while (ppVar10 = (*ppVar9->hash->create)(),
                          ppVar10 != (ptls_hash_context_t *)0x0) {
                      (*ppVar10->update)(ppVar10,puVar13,uVar11);
                      (*ppVar10->final)(ppVar10,paVar8->record_digest,PTLS_HASH_FINAL_MODE_FREE);
                      local_48 = local_48 + 1;
                      paVar8 = esni->cipher_suites + local_48;
                      ppVar9 = *(ptls_cipher_suite_t **)
                                (esni->cipher_suites->record_digest + local_40 + -8);
                      local_40 = local_40 + 0x48;
                      if (ppVar9 == (ptls_cipher_suite_t *)0x0) {
                        return 0;
                      }
                    }
                    goto LAB_0011431a;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00113fad:
  iVar3 = 0x32;
LAB_00114320:
  ptls_esni_dispose_context(esni);
  return iVar3;
}

Assistant:

int ptls_esni_init_context(ptls_context_t *ctx, ptls_esni_context_t *esni, ptls_iovec_t esni_keys,
                           ptls_key_exchange_context_t **key_exchanges)
{
    const uint8_t *src = esni_keys.base, *const end = src + esni_keys.len;
    size_t num_key_exchanges, num_cipher_suites = 0;
    int ret;

    for (num_key_exchanges = 0; key_exchanges[num_key_exchanges] != NULL; ++num_key_exchanges)
        ;

    memset(esni, 0, sizeof(*esni));
    if ((esni->key_exchanges = malloc(sizeof(*esni->key_exchanges) * (num_key_exchanges + 1))) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    memcpy(esni->key_exchanges, key_exchanges, sizeof(*esni->key_exchanges) * (num_key_exchanges + 1));

    /* ESNIKeys */
    if ((ret = ptls_decode16(&esni->version, &src, end)) != 0)
        goto Exit;
    /* Skip checksum fields */
    if (end - src < 4) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    src += 4;
    /* Published SNI field */
    ptls_decode_open_block(src, end, 2, { src = end; });

    /* Process the list of KeyShareEntries, verify for each of them that the ciphersuite is supported. */
    ptls_decode_open_block(src, end, 2, {
        do {
            /* parse */
            uint16_t id;
            if ((ret = ptls_decode16(&id, &src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(src, end, 2, { src = end; });
            /* check that matching key-share exists */
            ptls_key_exchange_context_t **found;
            for (found = key_exchanges; *found != NULL; ++found)
                if ((*found)->algo->id == id)
                    break;
            if (found == NULL) {
                ret = PTLS_ERROR_INCOMPATIBLE_KEY;
                goto Exit;
            }
        } while (src != end);
    });
    /* Process the list of cipher_suites. If they are supported, store in esni context  */
    ptls_decode_open_block(src, end, 2, {
        void *newp;
        do {
            uint16_t id;
            if ((ret = ptls_decode16(&id, &src, end)) != 0)
                goto Exit;
            size_t i;
            for (i = 0; ctx->cipher_suites[i] != NULL; ++i)
                if (ctx->cipher_suites[i]->id == id)
                    break;
            if (ctx->cipher_suites[i] != NULL) {
                if ((newp = realloc(esni->cipher_suites, sizeof(*esni->cipher_suites) * (num_cipher_suites + 1))) == NULL) {
                    ret = PTLS_ERROR_NO_MEMORY;
                    goto Exit;
                }
                esni->cipher_suites = newp;
                esni->cipher_suites[num_cipher_suites++].cipher_suite = ctx->cipher_suites[i];
            }
        } while (src != end);
        if ((newp = realloc(esni->cipher_suites, sizeof(*esni->cipher_suites) * (num_cipher_suites + 1))) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        esni->cipher_suites = newp;
        esni->cipher_suites[num_cipher_suites].cipher_suite = NULL;
    });
    /* Parse the padded length, not before, not after parameters */
    if ((ret = ptls_decode16(&esni->padded_length, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode64(&esni->not_before, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode64(&esni->not_after, &src, end)) != 0)
        goto Exit;
    /* Skip the extension fields */
    ptls_decode_block(src, end, 2, {
        while (src != end) {
            uint16_t ext_type;
            if ((ret = ptls_decode16(&ext_type, &src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(src, end, 2, { src = end; });
        }
    });

    { /* calculate digests for every cipher-suite */
        size_t i;
        for (i = 0; esni->cipher_suites[i].cipher_suite != NULL; ++i) {
            if ((ret = ptls_calc_hash(esni->cipher_suites[i].cipher_suite->hash, esni->cipher_suites[i].record_digest,
                                      esni_keys.base, esni_keys.len)) != 0)
                goto Exit;
        }
    }

    ret = 0;
Exit:
    if (ret != 0)
        ptls_esni_dispose_context(esni);
    return ret;
}